

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O1

long __thiscall
wasm::Random::pickGivenNum<long,unsigned_char,unsigned_short,unsigned_int,unsigned_long>
          (Random *this,size_t num,long first,uchar args,unsigned_short args_1,uint args_2,
          unsigned_long args_3)

{
  if (num != 0) {
    if (num == 1) {
      first = (long)args;
    }
    else if (num == 2) {
      first = (long)args_1;
    }
    else if (num == 3) {
      first = (long)args_2;
    }
    else {
      first = args_3;
      if (num != 4) {
        __assert_fail("num == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/random.h"
                      ,0x5d,"T wasm::Random::pickGivenNum(size_t, T) [T = long]");
      }
    }
  }
  return first;
}

Assistant:

T pickGivenNum(size_t num, T first, Args... args) {
    if (num == 0) {
      return first;
    }
    return pickGivenNum<T>(num - 1, args...);
  }